

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-tls.c
# Opt level: O3

void lws_tls_err_describe_clear(void)

{
  ulong e;
  char buf [160];
  char acStack_b8 [168];
  
  e = ERR_get_error();
  while (e != 0) {
    ERR_error_string_n(e,acStack_b8,0xa0);
    _lws_log(8,"   openssl error: %s\n",acStack_b8);
    e = ERR_get_error();
  }
  _lws_log(8,"\n");
  return;
}

Assistant:

void
lws_tls_err_describe_clear(void)
{
	char buf[160];
	unsigned long l;

	do {
		l = ERR_get_error();
		if (!l)
			break;

		ERR_error_string_n(
#if defined(LWS_WITH_BORINGSSL)
				(uint32_t)
#endif
				l, buf, sizeof(buf));
		lwsl_info("   openssl error: %s\n", buf);
	} while (l);
	lwsl_info("\n");
}